

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O0

FieldDecorationsIter __thiscall
spvtools::val::ValidationState_t::id_member_decorations
          (ValidationState_t *this,uint32_t id,uint32_t member_index)

{
  int *this_00;
  FieldDecorationsIter FVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  undefined1 local_a0 [8];
  Decoration max_decoration;
  undefined1 local_58 [8];
  Decoration min_decoration;
  mapped_type *decorations;
  uint32_t member_index_local;
  uint32_t id_local;
  ValidationState_t *this_local;
  FieldDecorationsIter result;
  
  decorations._0_4_ = member_index;
  decorations._4_4_ = id;
  _member_index_local = this;
  min_decoration._32_8_ =
       std::
       map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
       ::operator[](&this->id_decorations_,(key_type_conflict *)((long)&decorations + 4));
  max_decoration.struct_member_index_ = 0;
  max_decoration._36_4_ = 0;
  this_00 = &max_decoration.struct_member_index_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  Decoration::Decoration
            ((Decoration *)local_58,DecorationRelaxedPrecision,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(uint32_t)decorations);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b8);
  Decoration::Decoration((Decoration *)local_a0,DecorationMax,&local_b8,(uint32_t)decorations);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b8);
  FieldDecorationsIter::FieldDecorationsIter((FieldDecorationsIter *)&this_local);
  this_local = (ValidationState_t *)
               std::
               set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
               ::lower_bound((set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                              *)min_decoration._32_8_,(Decoration *)local_58);
  result.begin = std::
                 set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                 ::upper_bound((set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                                *)min_decoration._32_8_,(Decoration *)local_a0);
  Decoration::~Decoration((Decoration *)local_a0);
  Decoration::~Decoration((Decoration *)local_58);
  FVar1.end._M_node = result.begin._M_node;
  FVar1.begin._M_node = (_Base_ptr)this_local;
  return FVar1;
}

Assistant:

FieldDecorationsIter id_member_decorations(uint32_t id,
                                             uint32_t member_index) {
    const auto& decorations = id_decorations_[id];

    // The decorations are sorted by member_index, so this look up will give the
    // exact range of decorations for this member index.
    Decoration min_decoration((spv::Decoration)0, {}, member_index);
    Decoration max_decoration(spv::Decoration::Max, {}, member_index);

    FieldDecorationsIter result;
    result.begin = decorations.lower_bound(min_decoration);
    result.end = decorations.upper_bound(max_decoration);

    return result;
  }